

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interlink.cpp
# Opt level: O2

void __thiscall indk::Interlink::Interlink(Interlink *this)

{
  (this->Host)._M_dataplus._M_p = (pointer)&(this->Host).field_2;
  (this->Host)._M_string_length = 0;
  (this->Host).field_2._M_local_buf[0] = '\0';
  (this->InputPort)._M_dataplus._M_p = (pointer)&(this->InputPort).field_2;
  (this->InputPort)._M_string_length = 0;
  (this->InputPort).field_2._M_local_buf[0] = '\0';
  (this->OutputPort)._M_dataplus._M_p = (pointer)&(this->OutputPort).field_2;
  (this->OutputPort)._M_string_length = 0;
  (this->OutputPort).field_2._M_local_buf[0] = '\0';
  (this->Thread)._M_id._M_thread = 0;
  (this->Structure)._M_dataplus._M_p = (pointer)&(this->Structure).field_2;
  (this->Structure)._M_string_length = 0;
  (this->Structure).field_2._M_local_buf[0] = '\0';
  this->Input = (void *)0x0;
  this->Output = (void *)0x0;
  LOCK();
  (this->Interlinked)._M_base._M_i = false;
  UNLOCK();
  doInitInput(this,0x1138,5);
  return;
}

Assistant:

indk::Interlink::Interlink() {
    Input = nullptr;
    Output = nullptr;
    Interlinked.store(false);
    doInitInput(4408, 5);
}